

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElementAnimation.cpp
# Opt level: O0

NumericValue
Rml::InterpolateNumericValue
          (NumericValue v0,NumericValue v1,float alpha,Element *element,
          PropertyDefinition *definition)

{
  Unit lhs;
  bool bVar1;
  Units UVar2;
  RelativeTarget RVar3;
  ElementStyle *pEVar4;
  float fVar5;
  NumericValue *local_a0;
  float local_7c;
  NumericValue local_78;
  float local_70;
  float local_6c;
  NumericValue NStack_68;
  float f;
  float local_60;
  NumericValue NStack_5c;
  float f1_1;
  float local_54;
  NumericValue NStack_50;
  float f0_1;
  float local_48;
  NumericValue NStack_44;
  float f1;
  float local_3c;
  PropertyDefinition *pPStack_38;
  float f0;
  PropertyDefinition *definition_local;
  Element *element_local;
  NumericValue NStack_20;
  float alpha_local;
  NumericValue v1_local;
  NumericValue v0_local;
  
  v1_local.unit = v0.unit;
  alpha_local = (float)v1.unit;
  pPStack_38 = definition;
  definition_local = (PropertyDefinition *)element;
  element_local._4_4_ = alpha;
  NStack_20 = v1;
  v1_local = v0;
  if ((float)v1_local.unit == alpha_local) {
    fVar5 = Mix<float>(&v1_local.number,&stack0xffffffffffffffe0.number,alpha);
    NumericValue::NumericValue(&v0_local,fVar5,v1_local.unit);
  }
  else {
    lhs = v1_local.unit;
    UVar2 = operator&(lhs,NUMBER_LENGTH_PERCENT);
    bVar1 = Any(UVar2);
    if (bVar1) {
      UVar2 = operator&((Units)alpha_local,NUMBER_LENGTH_PERCENT);
      bVar1 = Any(UVar2);
      if ((bVar1) && (pPStack_38 != (PropertyDefinition *)0x0)) {
        pEVar4 = Element::GetStyle((Element *)definition_local);
        NStack_44 = v1_local;
        RVar3 = PropertyDefinition::GetRelativeTarget(pPStack_38);
        local_3c = ElementStyle::ResolveRelativeLength(pEVar4,NStack_44,RVar3);
        pEVar4 = Element::GetStyle((Element *)definition_local);
        NStack_50 = NStack_20;
        RVar3 = PropertyDefinition::GetRelativeTarget(pPStack_38);
        local_48 = ElementStyle::ResolveRelativeLength(pEVar4,NStack_50,RVar3);
        fVar5 = Mix<float>(&local_3c,&local_48,element_local._4_4_);
        NumericValue::NumericValue(&v0_local,fVar5,PX);
        return v0_local;
      }
    }
    UVar2 = operator&(v1_local.unit,LENGTH);
    bVar1 = Any(UVar2);
    if (bVar1) {
      UVar2 = operator&((Units)alpha_local,LENGTH);
      bVar1 = Any(UVar2);
      if (bVar1) {
        NStack_5c = v1_local;
        local_54 = Element::ResolveLength((Element *)definition_local,v1_local);
        NStack_68 = v1_local;
        local_60 = Element::ResolveLength((Element *)definition_local,v1_local);
        fVar5 = Mix<float>(&local_54,&local_60,element_local._4_4_);
        NumericValue::NumericValue(&v0_local,fVar5,PX);
        return v0_local;
      }
    }
    UVar2 = operator&(v1_local.unit,ANGLE);
    bVar1 = Any(UVar2);
    if (bVar1) {
      UVar2 = operator&((Units)alpha_local,ANGLE);
      bVar1 = Any(UVar2);
      if (bVar1) {
        local_78 = v1_local;
        local_70 = ComputeAngle(v1_local);
        local_7c = ComputeAngle(NStack_20);
        local_6c = Mix<float>(&local_70,&local_7c,element_local._4_4_);
        NumericValue::NumericValue(&v0_local,local_6c,RAD);
        return v0_local;
      }
    }
    if (0.5 <= element_local._4_4_) {
      local_a0 = &stack0xffffffffffffffe0;
    }
    else {
      local_a0 = &v1_local;
    }
    v0_local = *local_a0;
  }
  return v0_local;
}

Assistant:

static NumericValue InterpolateNumericValue(NumericValue v0, NumericValue v1, float alpha, Element& element, const PropertyDefinition* definition)
{
	// If we have the same units, we can simply interpolate regardless of what the value represents.
	if (v0.unit == v1.unit)
		return NumericValue{Mix(v0.number, v1.number, alpha), v0.unit};

	// When mixing lengths or relative sizes, resolve them to pixel lengths and interpolate. This only works if we have a definition.
	if (Any(v0.unit & Unit::NUMBER_LENGTH_PERCENT) && Any(v1.unit & Unit::NUMBER_LENGTH_PERCENT) && definition)
	{
		float f0 = element.GetStyle()->ResolveRelativeLength(v0, definition->GetRelativeTarget());
		float f1 = element.GetStyle()->ResolveRelativeLength(v1, definition->GetRelativeTarget());
		return NumericValue{Mix(f0, f1, alpha), Unit::PX};
	}

	// As long as we don't mix lengths and percentages, we can still resolve lengths without a definition.
	if (Any(v0.unit & Unit::LENGTH) && Any(v1.unit & Unit::LENGTH))
	{
		float f0 = element.ResolveLength(v0);
		float f1 = element.ResolveLength(v0);
		return NumericValue{Mix(f0, f1, alpha), Unit::PX};
	}

	if (Any(v0.unit & Unit::ANGLE) && Any(v1.unit & Unit::ANGLE))
	{
		float f = Mix(ComputeAngle(v0), ComputeAngle(v1), alpha);
		return NumericValue{f, Unit::RAD};
	}

	// Fall back to discrete interpolation for incompatible units.
	return alpha < 0.5f ? v0 : v1;
}